

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCnf.c
# Opt level: O0

Ssw_Sat_t * Ssw_SatStart(int fPolarFlip)

{
  int Entry;
  Vec_Int_t *pVVar1;
  Vec_Ptr_t *pVVar2;
  sat_solver *psVar3;
  lit local_1c;
  Ssw_Sat_t *pSStack_18;
  int Lit;
  Ssw_Sat_t *p;
  int fPolarFlip_local;
  
  p._4_4_ = fPolarFlip;
  pSStack_18 = (Ssw_Sat_t *)malloc(0x40);
  memset(pSStack_18,0,0x40);
  pSStack_18->pAig = (Aig_Man_t *)0x0;
  pSStack_18->fPolarFlip = p._4_4_;
  pVVar1 = Vec_IntStart(10000);
  pSStack_18->vSatVars = pVVar1;
  pVVar2 = Vec_PtrAlloc(100);
  pSStack_18->vFanins = pVVar2;
  pVVar2 = Vec_PtrAlloc(100);
  pSStack_18->vUsedPis = pVVar2;
  psVar3 = sat_solver_new();
  pSStack_18->pSat = psVar3;
  sat_solver_setnvars(pSStack_18->pSat,1000);
  pSStack_18->nSatVars = 1;
  local_1c = toLit(pSStack_18->nSatVars);
  if (p._4_4_ != 0) {
    local_1c = lit_neg(local_1c);
  }
  sat_solver_addclause(pSStack_18->pSat,&local_1c,(lit *)&stack0xffffffffffffffe8);
  Entry = pSStack_18->nSatVars;
  pSStack_18->nSatVars = Entry + 1;
  Vec_IntWriteEntry(pSStack_18->vSatVars,0,Entry);
  return pSStack_18;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the SAT manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Ssw_Sat_t * Ssw_SatStart( int fPolarFlip )
{
    Ssw_Sat_t * p;
    int Lit;
    p = ABC_ALLOC( Ssw_Sat_t, 1 );
    memset( p, 0, sizeof(Ssw_Sat_t) );
    p->pAig          = NULL;
    p->fPolarFlip    = fPolarFlip;
    p->vSatVars      = Vec_IntStart( 10000 );
    p->vFanins       = Vec_PtrAlloc( 100 );
    p->vUsedPis      = Vec_PtrAlloc( 100 );
    p->pSat          = sat_solver_new();
    sat_solver_setnvars( p->pSat, 1000 );
    // var 0 is not used
    // var 1 is reserved for const1 node - add the clause
    p->nSatVars = 1;
    Lit = toLit( p->nSatVars );
    if ( fPolarFlip )
        Lit = lit_neg( Lit );
    sat_solver_addclause( p->pSat, &Lit, &Lit + 1 );
//    Ssw_ObjSetSatNum( p, Aig_ManConst1(p->pAig), p->nSatVars++ );
    Vec_IntWriteEntry( p->vSatVars, 0, p->nSatVars++ );
    return p;
}